

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSpatialAnchorsCreateInfoBaseHeaderML *value)

{
  XrStructureType type;
  bool bVar1;
  XrResult XVar2;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  allocator local_99;
  string error_str;
  string local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_58;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_40;
  
  type = value->type;
  if (type == XR_TYPE_SPATIAL_ANCHORS_CREATE_INFO_FROM_UUIDS_ML) {
    if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_ML_spatial_anchors_storage")
       , bVar1)) {
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                               (XrSpatialAnchorsCreateInfoFromUuidsML *)value);
      return XVar2;
    }
    std::__cxx11::string::string
              ((string *)&error_str,
               "XrSpatialAnchorsCreateInfoBaseHeaderML being used with child struct type ",
               (allocator *)&local_78);
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::string
              ((string *)&local_78,"VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-type",&local_99
              );
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_58,objects_info);
    CoreValidLogMessage(instance_info,&local_78,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_58,&error_str);
    this = &local_58;
  }
  else {
    if (type != XR_TYPE_SPATIAL_ANCHORS_CREATE_INFO_FROM_POSE_ML) {
      InvalidStructureType
                (instance_info,command_name,objects_info,"XrSpatialAnchorsCreateInfoBaseHeaderML",
                 type,"VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-type",XR_TYPE_UNKNOWN,"");
      return XR_ERROR_VALIDATION_FAILURE;
    }
    if ((instance_info == (GenValidUsageXrInstanceInfo *)0x0) ||
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_ML_spatial_anchors"), bVar1)
       ) {
      XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                               (XrSpatialAnchorsCreateInfoFromPoseML *)value);
      return XVar2;
    }
    std::__cxx11::string::string
              ((string *)&error_str,
               "XrSpatialAnchorsCreateInfoBaseHeaderML being used with child struct type ",
               (allocator *)&local_78);
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::string
              ((string *)&local_78,"VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-type",&local_99
              );
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_40,objects_info);
    CoreValidLogMessage(instance_info,&local_78,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_40,&error_str);
    this = &local_40;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&error_str);
  return XR_ERROR_VALIDATION_FAILURE;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSpatialAnchorsCreateInfoBaseHeaderML* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // NOTE: Can't validate "VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-next-next" because it is a base structure
    if (value->type == XR_TYPE_SPATIAL_ANCHORS_CREATE_INFO_FROM_POSE_ML) {
        const XrSpatialAnchorsCreateInfoFromPoseML* new_value = reinterpret_cast<const XrSpatialAnchorsCreateInfoFromPoseML*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_ML_spatial_anchors")) {
            std::string error_str = "XrSpatialAnchorsCreateInfoBaseHeaderML being used with child struct type ";
            error_str += "\"XR_TYPE_SPATIAL_ANCHORS_CREATE_INFO_FROM_POSE_ML\"";
            error_str += " which requires extension \"XR_ML_spatial_anchors\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    if (value->type == XR_TYPE_SPATIAL_ANCHORS_CREATE_INFO_FROM_UUIDS_ML) {
        const XrSpatialAnchorsCreateInfoFromUuidsML* new_value = reinterpret_cast<const XrSpatialAnchorsCreateInfoFromUuidsML*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_ML_spatial_anchors_storage")) {
            std::string error_str = "XrSpatialAnchorsCreateInfoBaseHeaderML being used with child struct type ";
            error_str += "\"XR_TYPE_SPATIAL_ANCHORS_CREATE_INFO_FROM_UUIDS_ML\"";
            error_str += " which requires extension \"XR_ML_spatial_anchors_storage\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    InvalidStructureType(instance_info, command_name, objects_info, "XrSpatialAnchorsCreateInfoBaseHeaderML",
                         value->type, "VUID-XrSpatialAnchorsCreateInfoBaseHeaderML-type-type");
    return XR_ERROR_VALIDATION_FAILURE;
}